

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O2

int __thiscall
PoolList<Future<void>::Private::ThreadPool::ThreadContext>::remove
          (PoolList<Future<void>::Private::ThreadPool::ThreadContext> *this,char *__filename)

{
  PoolList<Future<void>::Private::ThreadPool::ThreadContext> *pPVar1;
  Item *pIVar2;
  PoolList<Future<void>::Private::ThreadPool::ThreadContext> *pPVar3;
  
  pPVar1 = *(PoolList<Future<void>::Private::ThreadPool::ThreadContext> **)(__filename + -0x10);
  pIVar2 = *(Item **)(__filename + -8);
  pPVar3 = pPVar1;
  if (pPVar1 == (PoolList<Future<void>::Private::ThreadPool::ThreadContext> *)0x0) {
    pPVar3 = this;
  }
  (pPVar3->_begin).item = pIVar2;
  pIVar2->prev = (Item *)pPVar1;
  this->_size = this->_size - 1;
  Thread::~Thread((Thread *)__filename);
  pIVar2 = this->freeItem;
  *(Item **)(__filename + -0x10) = pIVar2;
  this->freeItem = (Item *)(__filename + -0x10);
  return (int)pIVar2;
}

Assistant:

void remove(const T& value)
  {
    Item* item = (Item*)&value - 1;

    if(!item->prev)
      (_begin.item = item->next)->prev = 0;
    else
      (item->prev->next = item->next)->prev = item->prev;

    --_size;

    ((T*)(item + 1))->~T();
    item->prev = freeItem;
    freeItem = item;
  }